

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestCase * __thiscall
testing::internal::UnitTestImpl::GetTestCase
          (UnitTestImpl *this,char *test_case_name,char *type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  int iVar1;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  __last;
  bool bVar2;
  __normal_iterator<testing::TestCase_**,_std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>_>
  _Var3;
  TestCase *this_00;
  TestCaseNameIs local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  TearDownTestCaseFunc local_50;
  SetUpTestCaseFunc local_48;
  TestCase *local_40;
  TestCase *new_test_case;
  
  _Var3._M_current =
       (this->test_cases_).
       super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->test_cases_).
       super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_50 = tear_down_tc;
  local_48 = set_up_tc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,test_case_name,(allocator<char> *)&local_40);
  std::__cxx11::string::string((string *)&local_90,&local_70);
  _Var3 = std::
          find_if<__gnu_cxx::__normal_iterator<testing::TestCase**,std::vector<testing::TestCase*,std::allocator<testing::TestCase*>>>,testing::internal::TestCaseNameIs>
                    (_Var3,__last,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  if (_Var3._M_current ==
      (this->test_cases_).
      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (TestCase *)operator_new(0xf8);
    TestCase::TestCase(this_00,test_case_name,type_param,local_48,local_50);
    local_40 = this_00;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,test_case_name,(allocator<char> *)((long)&new_test_case + 7));
    bVar2 = UnitTestOptions::MatchesFilter(&local_70,"*DeathTest:*DeathTest/*");
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      iVar1 = this->last_death_test_case_;
      this->last_death_test_case_ = iVar1 + 1;
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::insert
                (&this->test_cases_,
                 (const_iterator)
                 ((this->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar1 + 1),&local_40);
    }
    else {
      std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::push_back
                (&this->test_cases_,&local_40);
    }
    local_70._M_dataplus._M_p._0_4_ =
         (undefined4)
         ((ulong)((long)(this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->test_case_indices_,(int *)&local_70);
  }
  else {
    local_40 = *_Var3._M_current;
  }
  return local_40;
}

Assistant:

TestCase* UnitTestImpl::GetTestCase(const char* test_case_name,
                                    const char* type_param,
                                    Test::SetUpTestCaseFunc set_up_tc,
                                    Test::TearDownTestCaseFunc tear_down_tc) {
  // Can we find a TestCase with the given name?
  const std::vector<TestCase*>::const_iterator test_case =
      std::find_if(test_cases_.begin(), test_cases_.end(),
                   TestCaseNameIs(test_case_name));

  if (test_case != test_cases_.end())
    return *test_case;

  // No.  Let's create one.
  TestCase* const new_test_case =
      new TestCase(test_case_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test case?
  if (internal::UnitTestOptions::MatchesFilter(test_case_name,
                                               kDeathTestCaseFilter)) {
    // Yes.  Inserts the test case after the last death test case
    // defined so far.  This only works when the test cases haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_case_;
    test_cases_.insert(test_cases_.begin() + last_death_test_case_,
                       new_test_case);
  } else {
    // No.  Appends to the end of the list.
    test_cases_.push_back(new_test_case);
  }

  test_case_indices_.push_back(static_cast<int>(test_case_indices_.size()));
  return new_test_case;
}